

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

result_type __thiscall Catch::SimplePcg32::operator()(SimplePcg32 *this)

{
  uint32_t uVar1;
  uint32_t output;
  uint32_t xorshifted;
  SimplePcg32 *this_local;
  
  uVar1 = anon_unknown_1::rotate_right
                    ((uint32_t)((this->m_state >> 0x12 ^ this->m_state) >> 0x1b),
                     (uint)(this->m_state >> 0x3b));
  this->m_state = this->m_state * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
  return uVar1;
}

Assistant:

SimplePcg32::result_type SimplePcg32::operator()() {
        // prepare the output value
        const uint32_t xorshifted = static_cast<uint32_t>(((m_state >> 18u) ^ m_state) >> 27u);
        const auto output = rotate_right(xorshifted, m_state >> 59u);

        // advance state
        m_state = m_state * 6364136223846793005ULL + s_inc;

        return output;
    }